

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncVersion(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
              vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  int64_t value;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  ExpressionValue::ExpressionValue(__return_storage_ptr__,0x6e);
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncVersion(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	int64_t value = ARMIPS_VERSION_MAJOR*1000 + ARMIPS_VERSION_MINOR*10 + ARMIPS_VERSION_REVISION;
	return ExpressionValue(value);
}